

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall geometrycentral::surface::SurfaceMesh::compressEdges(SurfaceMesh *this)

{
  allocator_type *__a;
  allocator_type *paVar1;
  SurfaceMesh *this_00;
  _List_node_base *p_Var2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _func_int **local_50;
  pointer local_38;
  
  if (this->useImplicitTwinFlag == false) {
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __a = (allocator_type *)&stack0xffffffffffffffb0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8,
               this->nEdgesFillCount,&INVALID_IND,__a);
    for (local_50 = (_func_int **)0x0; local_50 < (_func_int **)this->nEdgesFillCount;
        local_50 = (_func_int **)((long)local_50 + 1)) {
      __a = (allocator_type *)
            ((this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + (long)local_50 * 2);
      paVar1 = (allocator_type *)
               ((this->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + (long)local_50);
      if (this->useImplicitTwinFlag != false) {
        paVar1 = __a;
      }
      if (*(long *)paVar1 != -1) {
        __a = (allocator_type *)
              ((long)local_68._M_impl.super__Vector_impl_data._M_finish -
               (long)local_68._M_impl.super__Vector_impl_data._M_start >> 3);
        local_38[(long)local_50] = (unsigned_long)__a;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
                   (value_type_conflict1 *)&stack0xffffffffffffffb0);
      }
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffb0,
               (geometrycentral *)&this->eHalfedgeArr,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__a);
    this_00 = (SurfaceMesh *)&stack0xffffffffffffffb0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&this->eHalfedgeArr,this_00);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    updateValues(this_00,&this->heEdgeArr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffc8);
    this->nEdgesFillCount = this->nEdgesCount;
    this->nEdgesCapacityCount = this->nEdgesCount;
    p_Var2 = (_List_node_base *)&this->edgePermuteCallbackList;
    while (p_Var2 = (((_List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
                       *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var2 != (_List_node_base *)&this->edgePermuteCallbackList) {
      ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
      operator()((function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
                  *)(p_Var2 + 1),(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68)
      ;
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &stack0xffffffffffffffc8);
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  }
  return;
}

Assistant:

void SurfaceMesh::compressEdges() {

  if (usesImplicitTwin()) {
    // In the implicit-twin case, all updates are handled in the halfedge function (see note there)
    return;
  }

  // Build the compressing shift
  std::vector<size_t> newIndMap;                               // maps new ind -> old ind
  std::vector<size_t> oldIndMap(nEdgesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nEdgesFillCount; i++) {
    if (!edgeIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);
    }
  }

  // Permute & resize all per-edge arrays
  eHalfedgeArr = applyPermutation(eHalfedgeArr, newIndMap);

  // Update indices in all edge-valued arrays
  updateValues(heEdgeArr, oldIndMap);

  // Update counts
  nEdgesFillCount = nEdgesCount;
  nEdgesCapacityCount = nEdgesCount;

  // Invoke callbacks
  for (auto& f : edgePermuteCallbackList) {
    f(newIndMap);
  }
}